

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_int8_optional_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte n;
  char *pcVar5;
  
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar4 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar4 != 0)) {
    bVar1 = *(byte *)((long)td->table + uVar4);
    iVar3 = td->count;
    td->count = iVar3 + 1;
    if (iVar3 != 0) {
      pcVar5 = ctx->p;
      ctx->p = pcVar5 + 1;
      *pcVar5 = ',';
    }
    print_name(ctx,name,len);
    pcVar5 = ctx->p;
    n = bVar1;
    if ((char)bVar1 < '\0') {
      *pcVar5 = '-';
      pcVar5 = pcVar5 + 1;
      n = -bVar1;
    }
    iVar3 = print_uint8(n,pcVar5);
    ctx->p = ctx->p + (iVar3 + (uint)(bVar1 >> 7));
  }
  return;
}

Assistant:

static inline const void *get_field_ptr(flatcc_json_printer_table_descriptor_t *td, int id)
{
    uoffset_t vo = (uoffset_t)(id + 2) * (uoffset_t)sizeof(voffset_t);

    if (vo >= (uoffset_t)td->vsize) {
        return 0;
    }
    vo = read_voffset(td->vtable, vo);
    if (vo == 0) {
        return 0;
    }
    return (uint8_t *)td->table + vo;
}